

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O2

unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> __thiscall
duckdb::StreamQueryResult::FetchInternal(StreamQueryResult *this,ClientContextLock *lock)

{
  __uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> __p;
  StreamExecutionResult SVar1;
  BufferedData *pBVar2;
  pointer pDVar3;
  ClientContext *this_00;
  ClientContextLock *in_RDX;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> chunk;
  ErrorData error;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_1e0 [6];
  __uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> local_1b0 [48];
  
  local_1e0[0]._M_head_impl = (DataChunk *)0x0;
  pBVar2 = shared_ptr<duckdb::BufferedData,_true>::operator->
                     ((shared_ptr<duckdb::BufferedData,_true> *)(lock + 0x33));
  SVar1 = BufferedData::ReplenishBuffer(pBVar2,(StreamQueryResult *)lock,in_RDX);
  if ((SVar1 & ~CHUNK_NOT_READY) != EXECUTION_ERROR) {
    pBVar2 = shared_ptr<duckdb::BufferedData,_true>::operator->
                       ((shared_ptr<duckdb::BufferedData,_true> *)(lock + 0x33));
    (*pBVar2->_vptr_BufferedData[3])(local_1b0,pBVar2);
    __p._M_t.super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
    super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
         local_1b0[0]._M_t.
         super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
         super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl;
    local_1b0[0]._M_t.
    super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
    super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
         (tuple<duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>)
         (_Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>)0x0;
    ::std::__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::reset
              ((__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
               local_1e0,
               (pointer)__p._M_t.
                        super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>
                        .super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl);
    ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)local_1b0);
    if (local_1e0[0]._M_head_impl != (DataChunk *)0x0) {
      pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           *)local_1e0);
      if ((pDVar3->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pDVar3->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)local_1e0);
        if (pDVar3->count != 0) goto LAB_019d515c;
      }
    }
    this_00 = shared_ptr<duckdb::ClientContext,_true>::operator->
                        ((shared_ptr<duckdb::ClientContext,_true> *)(lock + 0x31));
    ClientContext::CleanupInternal(this_00,in_RDX,(BaseQueryResult *)lock,false);
    local_1b0[0]._M_t.
    super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
    super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
         (tuple<duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>)
         (_Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>)0x0;
    ::std::__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::reset
              ((__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
               local_1e0,(pointer)0x0);
    ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)local_1b0);
  }
LAB_019d515c:
  (this->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult =
       (_func_int **)local_1e0[0]._M_head_impl;
  local_1e0[0]._M_head_impl = (DataChunk *)0x0;
  ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
            ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)local_1e0);
  return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
         (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
}

Assistant:

unique_ptr<DataChunk> StreamQueryResult::FetchInternal(ClientContextLock &lock) {
	bool invalidate_query = true;
	unique_ptr<DataChunk> chunk;
	try {
		// fetch the chunk and return it
		auto stream_execution_result = buffered_data->ReplenishBuffer(*this, lock);
		if (ExecutionErrorOccurred(stream_execution_result)) {
			return chunk;
		}
		chunk = buffered_data->Scan();
		if (!chunk || chunk->ColumnCount() == 0 || chunk->size() == 0) {
			context->CleanupInternal(lock, this);
			chunk = nullptr;
		}
		return chunk;
	} catch (std::exception &ex) {
		ErrorData error(ex);
		if (!Exception::InvalidatesTransaction(error.Type())) {
			// standard exceptions do not invalidate the current transaction
			invalidate_query = false;
		} else if (Exception::InvalidatesDatabase(error.Type())) {
			// fatal exceptions invalidate the entire database
			auto &config = context->config;
			if (!config.query_verification_enabled) {
				auto &db_instance = DatabaseInstance::GetDatabase(*context);
				ValidChecker::Invalidate(db_instance, error.RawMessage());
			}
		}
		context->ProcessError(error, context->GetCurrentQuery());
		SetError(std::move(error));
	} catch (...) { // LCOV_EXCL_START
		SetError(ErrorData("Unhandled exception in FetchInternal"));
	} // LCOV_EXCL_STOP
	context->CleanupInternal(lock, this, invalidate_query);
	return nullptr;
}